

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::AssetPath> *this,double t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Sample s;
  Sample local_78;
  
  paVar1 = &local_78.value.asset_path_.field_2;
  local_78.value.asset_path_._M_string_length = 0;
  local_78.value.asset_path_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_78.value.resolved_path_.field_2;
  local_78.value.resolved_path_._M_string_length = 0;
  local_78.value.resolved_path_.field_2._M_local_buf[0] = '\0';
  local_78.blocked = true;
  local_78.t = t;
  local_78.value.asset_path_._M_dataplus._M_p = (pointer)paVar1;
  local_78.value.resolved_path_._M_dataplus._M_p = (pointer)paVar2;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
              *)this,&local_78);
  this->_dirty = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value.resolved_path_._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.value.resolved_path_._M_dataplus._M_p,
                    CONCAT71(local_78.value.resolved_path_.field_2._M_allocated_capacity._1_7_,
                             local_78.value.resolved_path_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value.asset_path_._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.value.asset_path_._M_dataplus._M_p,
                    CONCAT71(local_78.value.asset_path_.field_2._M_allocated_capacity._1_7_,
                             local_78.value.asset_path_.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }